

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::SGXMLScanner::anyAttributeValidation
          (SGXMLScanner *this,SchemaAttDef *attWildCard,uint uriId,bool *skipThisOne,
          bool *laxThisOne)

{
  bool bVar1;
  AttTypes AVar2;
  uint uVar3;
  DefAttTypes DVar4;
  QName *this_00;
  ValueVectorOf<unsigned_int> *this_01;
  uint *puVar5;
  ulong local_68;
  ulong uStack_50;
  DefAttTypes defType;
  XMLSize_t i;
  XMLSize_t listSize;
  ValueVectorOf<unsigned_int> *nameURIList;
  bool anyEncountered;
  AttTypes wildCardType;
  bool *laxThisOne_local;
  bool *skipThisOne_local;
  uint uriId_local;
  SchemaAttDef *attWildCard_local;
  SGXMLScanner *this_local;
  
  AVar2 = XMLAttDef::getType(&attWildCard->super_XMLAttDef);
  bVar1 = false;
  *skipThisOne = false;
  *laxThisOne = false;
  if (AVar2 == Any_Any) {
    bVar1 = true;
  }
  else if (AVar2 == Any_Other) {
    this_00 = SchemaAttDef::getAttName(attWildCard);
    uVar3 = QName::getURI(this_00);
    if ((uVar3 != uriId) && (uriId != (this->super_XMLScanner).fEmptyNamespaceId)) {
      bVar1 = true;
    }
  }
  else if (AVar2 == Any_List) {
    this_01 = SchemaAttDef::getNamespaceList(attWildCard);
    if (this_01 == (ValueVectorOf<unsigned_int> *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = ValueVectorOf<unsigned_int>::size(this_01);
    }
    if (local_68 != 0) {
      for (uStack_50 = 0; uStack_50 < local_68; uStack_50 = uStack_50 + 1) {
        puVar5 = ValueVectorOf<unsigned_int>::elementAt(this_01,uStack_50);
        if (*puVar5 == uriId) {
          bVar1 = true;
        }
      }
    }
  }
  if (bVar1 != false) {
    DVar4 = XMLAttDef::getDefaultType(&attWildCard->super_XMLAttDef);
    if (DVar4 == ProcessContents_Skip) {
      *skipThisOne = true;
      XMLScanner::getPSVIHandler(&this->super_XMLScanner);
    }
    else if (DVar4 == ProcessContents_Lax) {
      *laxThisOne = true;
    }
  }
  return bVar1;
}

Assistant:

bool SGXMLScanner::anyAttributeValidation(SchemaAttDef* attWildCard, unsigned int uriId, bool& skipThisOne, bool& laxThisOne)
{
    XMLAttDef::AttTypes wildCardType = attWildCard->getType();
    bool anyEncountered = false;
    skipThisOne = false;
    laxThisOne = false;
    if (wildCardType == XMLAttDef::Any_Any)
        anyEncountered = true;
    else if (wildCardType == XMLAttDef::Any_Other) {
        if (attWildCard->getAttName()->getURI() != uriId
            && uriId != fEmptyNamespaceId)
            anyEncountered = true;
    }
    else if (wildCardType == XMLAttDef::Any_List) {
        ValueVectorOf<unsigned int>* nameURIList = attWildCard->getNamespaceList();
        XMLSize_t listSize = (nameURIList) ? nameURIList->size() : 0;

        if (listSize) {
            for (XMLSize_t i=0; i < listSize; i++) {
                if (nameURIList->elementAt(i) == uriId)
                    anyEncountered = true;
            }
        }
    }

    if (anyEncountered) {
        XMLAttDef::DefAttTypes   defType   = attWildCard->getDefaultType();
        if (defType == XMLAttDef::ProcessContents_Skip) {
            // attribute should just be bypassed,
            skipThisOne = true;
            if (getPSVIHandler())
            {
                // REVISIT:
                // PSVIAttribute->setValidationAttempted(PSVIItem::VALIDATION_NONE);
            }
        }
        else if (defType == XMLAttDef::ProcessContents_Lax) {
            laxThisOne = true;
        }
    }

    return anyEncountered;
}